

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.cpp
# Opt level: O0

ExprNodePtr __thiscall punky::par::Parser::parse_if_expression(Parser *this)

{
  bool bVar1;
  Parser *in_RSI;
  undefined1 local_a0 [8];
  undefined1 local_98 [16];
  undefined1 local_88 [8];
  OptIfAltBlk alternative;
  unique_ptr<punky::ast::BlockStmt,_std::default_delete<punky::ast::BlockStmt>_> consequence;
  undefined1 local_68 [8];
  ExprNodePtr condition;
  undefined4 local_4c;
  Token if_tok;
  Parser *this_local;
  
  punky::tok::Token::Token((Token *)&stack0xffffffffffffffb8,&in_RSI->m_curr_tok);
  local_4c = LeftParen;
  bVar1 = expect_peek_and_consume(in_RSI,&stack0xffffffffffffffb4);
  if (((bVar1 ^ 0xffU) & 1) != 0) {
    std::unique_ptr<punky::ast::ExprNode,std::default_delete<punky::ast::ExprNode>>::
    unique_ptr<std::default_delete<punky::ast::ExprNode>,void>
              ((unique_ptr<punky::ast::ExprNode,std::default_delete<punky::ast::ExprNode>> *)this,
               (nullptr_t)0x0);
    condition._M_t.
    super___uniq_ptr_impl<punky::ast::ExprNode,_std::default_delete<punky::ast::ExprNode>_>._M_t.
    super__Tuple_impl<0UL,_punky::ast::ExprNode_*,_std::default_delete<punky::ast::ExprNode>_>.
    super__Head_base<0UL,_punky::ast::ExprNode_*,_false>._M_head_impl._0_4_ = 1;
    goto LAB_00119aca;
  }
  consume(in_RSI);
  parse_expression((Parser *)local_68,(PrecedenceLevel)in_RSI);
  consequence._M_t.
  super___uniq_ptr_impl<punky::ast::BlockStmt,_std::default_delete<punky::ast::BlockStmt>_>._M_t.
  super__Tuple_impl<0UL,_punky::ast::BlockStmt_*,_std::default_delete<punky::ast::BlockStmt>_>.
  super__Head_base<0UL,_punky::ast::BlockStmt_*,_false>._M_head_impl._4_4_ = 1;
  bVar1 = expect_peek_and_consume
                    (in_RSI,(TokenType *)
                            ((long)&consequence._M_t.
                                    super___uniq_ptr_impl<punky::ast::BlockStmt,_std::default_delete<punky::ast::BlockStmt>_>
                                    ._M_t.
                                    super__Tuple_impl<0UL,_punky::ast::BlockStmt_*,_std::default_delete<punky::ast::BlockStmt>_>
                                    .super__Head_base<0UL,_punky::ast::BlockStmt_*,_false>.
                                    _M_head_impl + 4));
  if (((bVar1 ^ 0xffU) & 1) == 0) {
    consequence._M_t.
    super___uniq_ptr_impl<punky::ast::BlockStmt,_std::default_delete<punky::ast::BlockStmt>_>._M_t.
    super__Tuple_impl<0UL,_punky::ast::BlockStmt_*,_std::default_delete<punky::ast::BlockStmt>_>.
    super__Head_base<0UL,_punky::ast::BlockStmt_*,_false>._M_head_impl._0_4_ = 4;
    bVar1 = expect_peek_and_consume(in_RSI,(TokenType *)&consequence);
    if (((bVar1 ^ 0xffU) & 1) == 0) {
      parse_block_statement
                ((Parser *)
                 &alternative.
                  super__Optional_base<std::unique_ptr<punky::ast::BlockStmt,_std::default_delete<punky::ast::BlockStmt>_>,_false,_false>
                  ._M_payload.
                  super__Optional_payload<std::unique_ptr<punky::ast::BlockStmt,_std::default_delete<punky::ast::BlockStmt>_>,_true,_false,_false>
                  .
                  super__Optional_payload_base<std::unique_ptr<punky::ast::BlockStmt,_std::default_delete<punky::ast::BlockStmt>_>_>
                  ._M_engaged);
      std::
      optional<std::unique_ptr<punky::ast::BlockStmt,_std::default_delete<punky::ast::BlockStmt>_>_>
      ::optional((optional<std::unique_ptr<punky::ast::BlockStmt,_std::default_delete<punky::ast::BlockStmt>_>_>
                  *)local_88);
      local_98._12_4_ = 0x1e;
      bVar1 = peek_type_is(in_RSI,(TokenType *)(local_98 + 0xc));
      if (bVar1) {
        consume(in_RSI);
        local_98._8_4_ = 4;
        bVar1 = expect_peek_and_consume(in_RSI,(TokenType *)(local_98 + 8));
        if (((bVar1 ^ 0xffU) & 1) == 0) {
          parse_block_statement((Parser *)local_98);
          std::
          optional<std::unique_ptr<punky::ast::BlockStmt,std::default_delete<punky::ast::BlockStmt>>>
          ::operator=((optional<std::unique_ptr<punky::ast::BlockStmt,std::default_delete<punky::ast::BlockStmt>>>
                       *)local_88,
                      (unique_ptr<punky::ast::BlockStmt,_std::default_delete<punky::ast::BlockStmt>_>
                       *)local_98);
          std::unique_ptr<punky::ast::BlockStmt,_std::default_delete<punky::ast::BlockStmt>_>::
          ~unique_ptr((unique_ptr<punky::ast::BlockStmt,_std::default_delete<punky::ast::BlockStmt>_>
                       *)local_98);
          goto LAB_00119a5e;
        }
        std::unique_ptr<punky::ast::ExprNode,std::default_delete<punky::ast::ExprNode>>::
        unique_ptr<std::default_delete<punky::ast::ExprNode>,void>
                  ((unique_ptr<punky::ast::ExprNode,std::default_delete<punky::ast::ExprNode>> *)
                   this,(nullptr_t)0x0);
      }
      else {
LAB_00119a5e:
        std::
        make_unique<punky::ast::IfExpression,punky::tok::Token&,std::unique_ptr<punky::ast::ExprNode,std::default_delete<punky::ast::ExprNode>>,std::unique_ptr<punky::ast::BlockStmt,std::default_delete<punky::ast::BlockStmt>>,std::optional<std::unique_ptr<punky::ast::BlockStmt,std::default_delete<punky::ast::BlockStmt>>>>
                  ((Token *)local_a0,
                   (unique_ptr<punky::ast::ExprNode,_std::default_delete<punky::ast::ExprNode>_> *)
                   &stack0xffffffffffffffb8,
                   (unique_ptr<punky::ast::BlockStmt,_std::default_delete<punky::ast::BlockStmt>_> *
                   )local_68,
                   (optional<std::unique_ptr<punky::ast::BlockStmt,_std::default_delete<punky::ast::BlockStmt>_>_>
                    *)&alternative.
                       super__Optional_base<std::unique_ptr<punky::ast::BlockStmt,_std::default_delete<punky::ast::BlockStmt>_>,_false,_false>
                       ._M_payload.
                       super__Optional_payload<std::unique_ptr<punky::ast::BlockStmt,_std::default_delete<punky::ast::BlockStmt>_>,_true,_false,_false>
                       .
                       super__Optional_payload_base<std::unique_ptr<punky::ast::BlockStmt,_std::default_delete<punky::ast::BlockStmt>_>_>
                       ._M_engaged);
        std::unique_ptr<punky::ast::ExprNode,std::default_delete<punky::ast::ExprNode>>::
        unique_ptr<punky::ast::IfExpression,std::default_delete<punky::ast::IfExpression>,void>
                  ((unique_ptr<punky::ast::ExprNode,std::default_delete<punky::ast::ExprNode>> *)
                   this,(unique_ptr<punky::ast::IfExpression,_std::default_delete<punky::ast::IfExpression>_>
                         *)local_a0);
        std::unique_ptr<punky::ast::IfExpression,_std::default_delete<punky::ast::IfExpression>_>::
        ~unique_ptr((unique_ptr<punky::ast::IfExpression,_std::default_delete<punky::ast::IfExpression>_>
                     *)local_a0);
      }
      condition._M_t.
      super___uniq_ptr_impl<punky::ast::ExprNode,_std::default_delete<punky::ast::ExprNode>_>._M_t.
      super__Tuple_impl<0UL,_punky::ast::ExprNode_*,_std::default_delete<punky::ast::ExprNode>_>.
      super__Head_base<0UL,_punky::ast::ExprNode_*,_false>._M_head_impl._0_4_ = 1;
      std::
      optional<std::unique_ptr<punky::ast::BlockStmt,_std::default_delete<punky::ast::BlockStmt>_>_>
      ::~optional((optional<std::unique_ptr<punky::ast::BlockStmt,_std::default_delete<punky::ast::BlockStmt>_>_>
                   *)local_88);
      std::unique_ptr<punky::ast::BlockStmt,_std::default_delete<punky::ast::BlockStmt>_>::
      ~unique_ptr((unique_ptr<punky::ast::BlockStmt,_std::default_delete<punky::ast::BlockStmt>_> *)
                  &alternative.
                   super__Optional_base<std::unique_ptr<punky::ast::BlockStmt,_std::default_delete<punky::ast::BlockStmt>_>,_false,_false>
                   ._M_payload.
                   super__Optional_payload<std::unique_ptr<punky::ast::BlockStmt,_std::default_delete<punky::ast::BlockStmt>_>,_true,_false,_false>
                   .
                   super__Optional_payload_base<std::unique_ptr<punky::ast::BlockStmt,_std::default_delete<punky::ast::BlockStmt>_>_>
                   ._M_engaged);
    }
    else {
      std::unique_ptr<punky::ast::ExprNode,std::default_delete<punky::ast::ExprNode>>::
      unique_ptr<std::default_delete<punky::ast::ExprNode>,void>
                ((unique_ptr<punky::ast::ExprNode,std::default_delete<punky::ast::ExprNode>> *)this,
                 (nullptr_t)0x0);
      condition._M_t.
      super___uniq_ptr_impl<punky::ast::ExprNode,_std::default_delete<punky::ast::ExprNode>_>._M_t.
      super__Tuple_impl<0UL,_punky::ast::ExprNode_*,_std::default_delete<punky::ast::ExprNode>_>.
      super__Head_base<0UL,_punky::ast::ExprNode_*,_false>._M_head_impl._0_4_ = 1;
    }
  }
  else {
    std::unique_ptr<punky::ast::ExprNode,std::default_delete<punky::ast::ExprNode>>::
    unique_ptr<std::default_delete<punky::ast::ExprNode>,void>
              ((unique_ptr<punky::ast::ExprNode,std::default_delete<punky::ast::ExprNode>> *)this,
               (nullptr_t)0x0);
    condition._M_t.
    super___uniq_ptr_impl<punky::ast::ExprNode,_std::default_delete<punky::ast::ExprNode>_>._M_t.
    super__Tuple_impl<0UL,_punky::ast::ExprNode_*,_std::default_delete<punky::ast::ExprNode>_>.
    super__Head_base<0UL,_punky::ast::ExprNode_*,_false>._M_head_impl._0_4_ = 1;
  }
  std::unique_ptr<punky::ast::ExprNode,_std::default_delete<punky::ast::ExprNode>_>::~unique_ptr
            ((unique_ptr<punky::ast::ExprNode,_std::default_delete<punky::ast::ExprNode>_> *)
             local_68);
LAB_00119aca:
  punky::tok::Token::~Token((Token *)&stack0xffffffffffffffb8);
  return (__uniq_ptr_data<punky::ast::ExprNode,_std::default_delete<punky::ast::ExprNode>,_true,_true>
          )(__uniq_ptr_data<punky::ast::ExprNode,_std::default_delete<punky::ast::ExprNode>,_true,_true>
            )this;
}

Assistant:

auto Parser::parse_if_expression() -> ast::ExprNodePtr
{
    auto if_tok = m_curr_tok;

    if (!expect_peek_and_consume(TokenType::LeftParen))
        return nullptr;
    consume();

    auto condition = parse_expression(PrecedenceLevel::Lowest);

    if (!expect_peek_and_consume(TokenType::RightParen))
        return nullptr;
    if (!expect_peek_and_consume(TokenType::LeftBrace))
        return nullptr;

    auto consequence = parse_block_statement();

    ast::OptIfAltBlk alternative;
    if (peek_type_is(TokenType::Else))
    {
        consume();
        if (!expect_peek_and_consume(TokenType::LeftBrace))
            return nullptr;

        alternative = parse_block_statement();
    }

    return std::make_unique<ast::IfExpression>(if_tok, std::move(condition),
                                               std::move(consequence), std::move(alternative));
}